

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type __thiscall
duckdb::Deserializer::Read<duckdb_parquet::CompressionCodec::type>(Deserializer *this)

{
  type tVar1;
  type tVar2;
  string str;
  char *local_28 [4];
  
  if (this[8] == (Deserializer)0x1) {
    (**(code **)(*(long *)this + 0xd0))(local_28);
    tVar1 = EnumUtil::FromString<duckdb_parquet::CompressionCodec::type>(local_28[0]);
    std::__cxx11::string::~string((string *)local_28);
    return tVar1;
  }
  tVar2 = (**(code **)(*(long *)this + 0x98))(this);
  return tVar2;
}

Assistant:

inline typename std::enable_if<std::is_enum<T>::value, T>::type Read() {
		if (deserialize_enum_from_string) {
			auto str = ReadString();
			return EnumUtil::FromString<T>(str.c_str());
		} else {
			return (T)Read<typename std::underlying_type<T>::type>();
		}
	}